

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
despot::Parser::GetNoisyNextState
          (Parser *this,vector<int,_std::allocator<int>_> *state,ACT_TYPE action,double *random)

{
  CPT *pCVar1;
  int iVar2;
  pointer piVar3;
  long lVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  pointer piVar8;
  ulong uVar9;
  
  piVar8 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if ((long)piVar3 - (long)piVar8 == 0) {
    (((this->action_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
      _M_impl.super__Vector_impl_data._M_start)->super_Variable).curr_value = action;
  }
  else {
    lVar4 = (long)piVar3 - (long)piVar8 >> 2;
    piVar6 = &(((this->prev_state_vars_).
                super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                super__Vector_impl_data._M_start)->super_NamedVar).super_Variable.curr_value;
    lVar7 = 0;
    do {
      *piVar6 = piVar8[lVar7];
      lVar7 = lVar7 + 1;
      piVar6 = piVar6 + 0x30;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar7);
    (((this->action_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
      _M_impl.super__Vector_impl_data._M_start)->super_Variable).curr_value = action;
    if (piVar3 != piVar8) {
      iVar5 = action + 0x3f;
      if (-1 < action) {
        iVar5 = action;
      }
      lVar4 = 0;
      uVar9 = 0;
      do {
        if ((*(ulong *)((ulong)(((long)action & 0x800000000000003fU) < 0x8000000000000001) * 8 + -8
                       + *(long *)((long)&(((this->is_identity_).
                                            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                          super__Bvector_impl_data._M_start.super__Bit_iterator_base
                                          ._M_p + lVar4) + (long)(iVar5 >> 6) * 8) &
            1L << ((byte)action & 0x3f)) == 0) {
          pCVar1 = (this->noisy_transition_funcs_).
                   super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9];
          iVar2 = (*(pCVar1->super_Function)._vptr_Function[0xe])(pCVar1,random);
          piVar8 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[uVar9] = iVar2;
          piVar3 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        uVar9 = uVar9 + 1;
        lVar4 = lVar4 + 0x28;
      } while (uVar9 < (ulong)((long)piVar3 - (long)piVar8 >> 2));
    }
  }
  return;
}

Assistant:

void Parser::GetNoisyNextState(vector<int>& state, ACT_TYPE action,
	double& random) const {
	for (int s = 0; s < state.size(); s++) {
		prev_state_vars_[s].curr_value = state[s];
	}
	action_vars_[0].curr_value = action;

	for (int s = 0; s < state.size(); s++) {
		if (!is_identity_[s][action])
			state[s] = noisy_transition_funcs_[s]->ComputeCurrentIndex(random);
	}
}